

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::RelinkFailure::Run(RelinkFailure *this)

{
  CallLogWrapper *this_00;
  GLuint program;
  allocator<char> local_b9;
  long error;
  char *local_b0 [4];
  GLuint vao;
  GLuint vbuf;
  char *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  char *varyings [2];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&local_88,this);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(local_b0,this);
  program = PIQBase::CreateProgram((PIQBase *)this,local_88,local_b0[0],false);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,1,"pos");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"pos",(allocator<char> *)local_b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,&local_88,1,&error);
  std::__cxx11::string::~string((string *)&local_88);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  local_88 = (char *)0x3f800000bf800000;
  uStack_80 = 0x3f80000000000000;
  local_78 = 0xbf800000bf800000;
  uStack_70 = 0x3f80000000000000;
  local_68 = 0x3f8000003f800000;
  uStack_60 = 0x3f80000000000000;
  local_58 = 0xbf8000003f800000;
  uStack_50 = 0x3f80000000000000;
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&vao);
  glu::CallLogWrapper::glBindVertexArray(this_00,vao);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&vbuf);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,vbuf);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,&local_88,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&vao);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&vbuf);
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"pos");
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  varyings[0] = "q";
  varyings[1] = "z";
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,program,2,varyings,0x8c8c);
  PIQBase::LinkProgram((PIQBase *)this,program);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"position",&local_b9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,local_b0,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"pos",&local_b9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,local_b0,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"color",&local_b9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,local_b0,0xffffffffffffffff,&error);
  std::__cxx11::string::~string((string *)local_b0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x502,&error);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return error;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindAttribLocation(program, 1, "pos");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "pos", 1, error);
		glUseProgram(program);

		tcu::Vec4 v[4] = { tcu::Vec4(-1, 1, 0, 1), tcu::Vec4(-1, -1, 0, 1), tcu::Vec4(1, 1, 0, 1),
						   tcu::Vec4(1, -1, 0, 1) };
		GLuint vao, vbuf;
		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbuf);
		glBindBuffer(GL_ARRAY_BUFFER, vbuf);
		glBufferData(GL_ARRAY_BUFFER, sizeof(v), v, GL_STATIC_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		glDisableVertexAttribArray(0);
		glDeleteVertexArrays(1, &vao);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glDeleteBuffers(1, &vbuf);

		glBindAttribLocation(program, 0, "pos");
		glBindAttribLocation(program, 0, "position");
		const char* varyings[2] = { "q", "z" };
		glTransformFeedbackVaryings(program, 2, varyings, GL_INTERLEAVED_ATTRIBS);
		LinkProgram(program);

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "position", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_INPUT, "pos", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);
		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", -1, error);
		ExpectError(GL_INVALID_OPERATION, error);

		glDeleteProgram(program);
		return error;
	}